

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

double __thiscall HPresolve::getColumnDualPost(HPresolve *this,int col)

{
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  size_type __n;
  size_type __n_00;
  double local_50;
  
  __n = (size_type)col;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Astart,__n);
  __n_00 = (size_type)*pvVar2;
  this_00 = &(this->super_HPreData).Aindex;
  local_50 = 0.0;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aend,__n);
    if ((long)*pvVar2 <= (long)__n_00) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       (&(this->super_HPreData).flagRow,(long)*pvVar2);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).valueRowDual,(long)*pvVar2);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).Avalue,__n_00);
      local_50 = local_50 + dVar1 * *pvVar3;
    }
    __n_00 = __n_00 + 1;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&(this->super_HPreData).colCostAtEl,__n)
  ;
  return local_50 + *pvVar3;
}

Assistant:

double HPresolve::getColumnDualPost(int col) {
	int row;
	double z;
	double sum = 0;
	for (int cnt=Astart.at(col); cnt<Aend.at(col); cnt++)
		if (flagRow.at(Aindex.at(cnt))) {
			row = Aindex.at(cnt);
			sum = sum + valueRowDual.at(row)*Avalue.at(cnt);
		}
	z = sum + colCostAtEl.at(col) ;
	return z;
}